

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardOptions.hpp
# Opt level: O1

void __thiscall
Configurable::QuickloadOption<MSX::Machine::Options>::declare_quickload_option
          (QuickloadOption<MSX::Machine::Options> *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"quickload","");
  Reflection::StructImpl<MSX::Machine::Options>::declare_emplace<bool>
            ((StructImpl<MSX::Machine::Options> *)(this + -0xc),&this->quickload,&local_38,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void declare_quickload_option() {
			static_cast<Owner *>(this)->declare(&quickload, "quickload");
		}